

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type mVar3;
  cmState *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  byte bVar13;
  bool b;
  bool b_00;
  key_type local_50;
  
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"deprecated","");
  this_00 = &this->DiagLevels;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::find(&this_00->_M_t,&local_50);
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"deprecated","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](this_00,&local_50);
    mVar3 = *pmVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (mVar3 < (DIAG_ERROR|DIAG_WARN)) {
      bVar13 = (byte)mVar3 & 7;
      SetSuppressDeprecatedWarnings(this,(bool)(1 >> bVar13));
      SetDeprecatedWarningsAsErrors(this,(bool)(4U >> bVar13 & 1));
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dev","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::find(&this_00->_M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node == p_Var1) goto LAB_0024ed7b;
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_WARN_DEPRECATED","");
  pcVar10 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_ERROR_DEPRECATED","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar5 = pcVar10 != (char *)0x0;
  bVar6 = pcVar11 != (char *)0x0;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dev","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::operator[](this_00,&local_50);
  mVar3 = *pmVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (mVar3 == DIAG_ERROR) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar5 || bVar6) goto LAB_0024ed7b;
    b_00 = true;
  }
  else if (mVar3 == DIAG_WARN) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,false);
    b_00 = false;
    if (bVar5 || bVar6) goto LAB_0024ed7b;
  }
  else {
    if (mVar3 != DIAG_IGNORE) goto LAB_0024ed7b;
    SetSuppressDevWarnings(this,true);
    b_00 = false;
    SetDevWarningsAsErrors(this,false);
    if (bVar5 || bVar6) goto LAB_0024ed7b;
    b = true;
  }
  SetSuppressDeprecatedWarnings(this,b);
  SetDeprecatedWarningsAsErrors(this,b_00);
LAB_0024ed7b:
  iVar7 = ActualConfigure(this);
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  pcVar10 = cmState::GetGlobalProperty(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    sVar12 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar10,pcVar10 + sVar12);
    iVar7 = HandleDeleteCacheVariables(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar7;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1)
    {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE)
      {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
      }
    else if (diagLevel == DIAG_WARN)
      {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
      }
    else if (diagLevel == DIAG_ERROR)
      {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
      }
    }

  if (this->DiagLevels.count("dev") == 1)
    {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
           this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
           this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated)
      {
      setDeprecatedVariables = true;
      }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE)
      {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables)
        {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
        }
      }
    else if (diagLevel == DIAG_WARN)
      {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables)
        {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
        }
      }
    else if (diagLevel == DIAG_ERROR)
      {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables)
        {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
        }
      }
    }

  int ret = this->ActualConfigure();
  const char* delCacheVars = this->State
                    ->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if(delCacheVars && delCacheVars[0] != 0)
    {
    return this->HandleDeleteCacheVariables(delCacheVars);
    }
  return ret;

}